

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::StrictMock<MockBinaryLogicalVisitor>::StrictMock
          (StrictMock<MockBinaryLogicalVisitor> *this)

{
  MockBinaryLogicalVisitor::MockBinaryLogicalVisitor(&this->super_MockBinaryLogicalVisitor);
  (this->super_MockBinaryLogicalVisitor).super_ExprVisitor<MockBinaryLogicalVisitor,_TestResult>.
  super_BasicExprVisitor<MockBinaryLogicalVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__StrictMock_001cdb90;
  Mock::FailUninterestingCalls(this);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }